

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O3

bool __thiscall
covenant::Solver<covenant::Sym>::refine
          (Solver<covenant::Sym> *this,witness_t *witness,GeneralizationMethod gen,
          bool REFINE_ONLY_FIRST)

{
  size_type *psVar1;
  pointer pCVar2;
  int iVar3;
  const_iterator cVar4;
  ostream *poVar5;
  long *plVar6;
  undefined **ppuVar7;
  undefined8 *puVar8;
  ulong uVar9;
  string *psVar10;
  undefined7 in_register_00000009;
  TermFactory *tfac;
  type __n;
  int iVar11;
  void *__buf;
  bool bVar12;
  pointer pDVar13;
  pointer pCVar14;
  undefined8 uVar15;
  char *pcVar16;
  ulong uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  witness_t tmp;
  dfa_t Cex;
  dfa_t gen_lang;
  key_type local_3b8;
  undefined1 *local_398;
  char *local_390;
  undefined1 local_388;
  undefined7 uStack_387;
  witness_impl *local_378;
  undefined4 local_36c;
  long *local_368;
  string local_360;
  TermFactory local_340;
  undefined1 local_330 [22];
  undefined1 auStack_31a [10];
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  local_310;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_2f8;
  vector<bool,_std::allocator<bool>_> local_2e0;
  ostream *local_2b8;
  TermFactory local_2b0;
  undefined1 local_2a0 [24];
  undefined1 *local_288;
  undefined1 local_280;
  undefined4 local_27c;
  DFA<covenant::Sym> local_278;
  undefined1 *local_208;
  long local_200;
  undefined1 local_1f8 [16];
  string local_1e8;
  CondEpsGen<covenant::Sym> local_1c8;
  DFA<covenant::Sym> local_a0;
  
  tfac = (TermFactory *)CONCAT71(in_register_00000009,REFINE_ONLY_FIRST);
  local_36c = SUB84(tfac,0);
  local_378 = (witness_impl *)witness;
  if (avy::AvyLogFlag == '\x01') {
    local_1c8.digest =
         (cfg_digest_t *)((long)&local_1c8.word.super__Vector_base<int,_std::allocator<int>_> + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"solver","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)avy::AvyLog_abi_cxx11_,(key_type *)&local_1c8);
    if (local_1c8.digest !=
        (cfg_digest_t *)((long)&local_1c8.word.super__Vector_base<int,_std::allocator<int>_> + 8U))
    {
      operator_delete(local_1c8.digest);
    }
    if (cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Solution found: ",0x10);
      local_2a0._0_8_ = (this->tfac).px;
      local_2a0._8_8_ = (this->tfac).pn.pi_;
      if ((sp_counted_base *)local_2a0._8_8_ != (sp_counted_base *)0x0) {
        LOCK();
        ((sp_counted_base *)local_2a0._8_8_)->use_count_ =
             ((sp_counted_base *)local_2a0._8_8_)->use_count_ + 1;
        UNLOCK();
      }
      witness_impl::to_string_abi_cxx11_((string *)&local_1c8,local_378,(witness_t *)local_2a0,tfac)
      ;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_1c8.digest,
                          (long)local_1c8.word.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if (local_1c8.digest !=
          (cfg_digest_t *)((long)&local_1c8.word.super__Vector_base<int,_std::allocator<int>_> + 8U)
         ) {
        operator_delete(local_1c8.digest);
      }
      boost::detail::shared_count::~shared_count((shared_count *)(local_2a0 + 8));
    }
  }
  if ((this->opts).is_dot_enabled == true) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_330,
               (vector<int,_std::allocator<int>_> *)local_378);
    local_2b0.px = (this->tfac).px;
    local_2b0.pn.pi_ = (this->tfac).pn.pi_;
    if (local_2b0.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_2b0.pn.pi_)->use_count_ = (local_2b0.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    witness_impl::to_automata<covenant::Sym>
              ((DFA<covenant::Sym> *)&local_1c8,(witness_t *)local_330,&local_2b0);
    boost::detail::shared_count::~shared_count(&local_2b0.pn);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Cex ","");
    DFA<covenant::Sym>::print_dot
              ((DFA<covenant::Sym> *)&local_1c8,(ostream *)&this->refine_log,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if (local_1c8.produce_rev.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      operator_delete(local_1c8.produce_rev.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
      local_1c8.produce_rev.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8.produce_rev.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_1c8.produced.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1c8.produced.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_offset = 0;
      local_1c8.produced.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)((long)&local_1c8.produce_fwd.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 + 8));
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               *)((long)&local_1c8.word.super__Vector_base<int,_std::allocator<int>_> + 0x10));
    boost::detail::shared_count::~shared_count((shared_count *)&local_1c8.word);
    if ((pointer)local_330._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_330._0_8_);
    }
  }
  if (gen == MAX_GEN) {
    plVar6 = (long *)operator_new(0x10);
    ppuVar7 = &PTR__EpsRefine_001a8fe8;
    *plVar6 = (long)&PTR__EpsRefine_001a8fe8;
    plVar6[1] = *(long *)&this->alphstart;
  }
  else {
    plVar6 = (long *)operator_new(8);
    ppuVar7 = &PTR__EpsRefine_001a9038;
    *plVar6 = (long)&PTR__EpsRefine_001a9038;
  }
  pCVar14 = (this->digests).
            super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->digests).
      super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pCVar14) {
    bVar12 = false;
  }
  else {
    local_2b8 = (ostream *)&this->refine_log;
    bVar12 = false;
    uVar17 = 0;
    local_368 = plVar6;
    do {
      if (((this->exact).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
           ._M_start.super__Bit_iterator_base._M_p[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) == 0) {
        local_340.px = (this->tfac).px;
        local_340.pn.pi_ = (this->tfac).pn.pi_;
        if (local_340.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_340.pn.pi_)->use_count_ = (local_340.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        CondEpsGen<covenant::Sym>::CondEpsGen
                  (&local_1c8,pCVar14 + uVar17,(vector<int,_std::allocator<int>_> *)local_378,
                   &local_340);
        boost::detail::shared_count::~shared_count(&local_340.pn);
        iVar3 = (local_1c8.digest)->startSym * local_1c8.nstates * local_1c8.nstates;
        iVar11 = local_1c8.nstates + iVar3 + -1;
        iVar3 = iVar3 + local_1c8.nstates + 0x3e;
        if (-1 < iVar11) {
          iVar3 = iVar11;
        }
        if ((local_1c8.produced.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             [(long)(iVar3 >> 6) +
              ((ulong)(((long)iVar11 & 0x800000000000003fU) < 0x8000000000000001) - 1)] >>
             ((long)iVar11 & 0x3fU) & 1) == 0) {
          (**(code **)(*local_368 + 0x10))(&local_a0,local_368,&local_1c8);
          DFA<covenant::Sym>::eps_elim(&local_a0);
          if ((this->opts).is_dot_enabled == true) {
            local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3b8,"Generalized cex wrt CFG ","");
            local_398 = &local_388;
            local_390 = (char *)0x0;
            local_388 = 0;
            auStack_31a._2_8_ = local_330 + 2;
            local_280 = 0x30;
            local_27c = 0x30;
            local_310.
            super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_31a;
            local_2a0._16_4_ = (int)uVar17;
            local_288 = auStack_31a;
            auStack_31a._2_8_ =
                 boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::
                 convert((lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> *)
                         (local_2a0 + 0x10));
            local_310.
            super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_31a;
            std::__cxx11::string::replace((ulong)&local_398,0,local_390,auStack_31a._2_8_);
            uVar15 = (char *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
              uVar15 = local_3b8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_390 + local_3b8._M_string_length) {
              pcVar16 = (char *)0xf;
              if (local_398 != &local_388) {
                pcVar16 = (char *)CONCAT71(uStack_387,local_388);
              }
              if (pcVar16 < local_390 + local_3b8._M_string_length) goto LAB_0014a1c3;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_398,0,(char *)0x0,(ulong)local_3b8._M_dataplus._M_p)
              ;
            }
            else {
LAB_0014a1c3:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_3b8,(ulong)local_398);
            }
            psVar1 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_360.field_2._M_allocated_capacity = *psVar1;
              local_360.field_2._8_8_ = puVar8[3];
              local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
            }
            else {
              local_360.field_2._M_allocated_capacity = *psVar1;
              local_360._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_360._M_string_length = puVar8[1];
            *puVar8 = psVar1;
            puVar8[1] = 0;
            *(undefined1 *)psVar1 = 0;
            DFA<covenant::Sym>::print_dot(&local_a0,local_2b8,&local_360);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p);
            }
            if (local_398 != &local_388) {
              operator_delete(local_398);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
              operator_delete(local_3b8._M_dataplus._M_p);
            }
          }
          pCVar2 = (this->cfgs).super__Vector_base<covenant::CFG,_std::allocator<covenant::CFG>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          DFA<covenant::Sym>::difference
                    ((optional<covenant::DFA<covenant::Sym>_> *)local_330,
                     (this->reg_langs).
                     super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar17,&local_a0,
                     pCVar2[uVar17].alphstart,pCVar2[uVar17].alphsz);
          if (local_330[0] == false) {
            psVar10 = (string *)__cxa_allocate_exception(0x20);
            local_208 = local_1f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_208,"refinement did not make any progress","");
            *(string **)psVar10 = psVar10 + 0x10;
            std::__cxx11::string::_M_construct<char*>(psVar10,local_208,local_208 + local_200);
            __cxa_throw(psVar10,&error::typeinfo,error::~error);
          }
          pDVar13 = (this->reg_langs).
                    super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar17;
          if ((sp_counted_base *)stack0xfffffffffffffce0 != (sp_counted_base *)0x0) {
            LOCK();
            *(uint_least32_t *)(stack0xfffffffffffffce0 + 8) =
                 *(uint_least32_t *)(stack0xfffffffffffffce0 + 8) + 1;
            UNLOCK();
          }
          local_3b8._M_dataplus._M_p = (pointer)(pDVar13->_tfac).px;
          (pDVar13->_tfac).px = (element_type *)local_330._8_8_;
          local_3b8._M_string_length = (size_type)(pDVar13->_tfac).pn.pi_;
          (pDVar13->_tfac).pn.pi_ = (sp_counted_base *)stack0xfffffffffffffce0;
          boost::detail::shared_count::~shared_count((shared_count *)&local_3b8._M_string_length);
          pDVar13->start = auStack_31a._2_4_;
          std::
          vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
          ::operator=(&pDVar13->trans,&local_310);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator=(&pDVar13->eps,&local_2f8);
          std::vector<bool,_std::allocator<bool>_>::operator=(&pDVar13->accepts,&local_2e0);
          if (avy::AvyLogFlag == '\x01') {
            local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"solver","");
            cVar4 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)avy::AvyLog_abi_cxx11_,&local_3b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
              operator_delete(local_3b8._M_dataplus._M_p);
            }
            if (cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"New refined regular approximation:\n",0x23);
              if (local_330[0] == false) {
                __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",
                              0x4bc,
                              "reference_type boost::optional<covenant::DFA<covenant::Sym>>::get() [T = covenant::DFA<covenant::Sym>]"
                             );
              }
              local_278._tfac.px = (element_type *)local_330._8_8_;
              local_278._tfac.pn.pi_ = (sp_counted_base *)stack0xfffffffffffffce0;
              if ((sp_counted_base *)stack0xfffffffffffffce0 != (sp_counted_base *)0x0) {
                LOCK();
                *(uint_least32_t *)(stack0xfffffffffffffce0 + 8) =
                     *(uint_least32_t *)(stack0xfffffffffffffce0 + 8) + 1;
                UNLOCK();
              }
              local_278.start = auStack_31a._2_4_;
              __n = (type)local_330._8_8_;
              std::
              vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
              ::vector(&local_278.trans,&local_310);
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::vector(&local_278.eps,&local_2f8);
              std::vector<bool,_std::allocator<bool>_>::vector(&local_278.accepts,&local_2e0);
              poVar5 = (ostream *)DFA<covenant::Sym>::write(&local_278,0x1ab2b8,__buf,(size_t)__n);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
              if (local_278.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  (_Bit_type *)0x0) {
                operator_delete(local_278.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl
                                .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
                local_278.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                local_278.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
                local_278.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                local_278.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
                local_278.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
              }
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::~vector(&local_278.eps);
              std::
              vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
              ::~vector(&local_278.trans);
              boost::detail::shared_count::~shared_count(&local_278._tfac.pn);
            }
          }
          if (avy::AvyLogFlag == '\x01') {
            local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"verbose","");
            cVar4 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)avy::AvyLog_abi_cxx11_,&local_3b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
              operator_delete(local_3b8._M_dataplus._M_p);
            }
            if (cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Automata ",9);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," refined.\n",10);
            }
          }
          boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::~optional_base
                    ((optional_base<covenant::DFA<covenant::Sym>_> *)local_330);
          if (local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&local_a0.eps);
          std::
          vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
          ::~vector(&local_a0.trans);
          boost::detail::shared_count::~shared_count(&local_a0._tfac.pn);
          CondEpsGen<covenant::Sym>::~CondEpsGen(&local_1c8);
          bVar12 = true;
          if ((char)local_36c != '\0') break;
        }
        else {
          if (avy::AvyLogFlag == '\x01') {
            local_330._0_8_ = local_330 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"verbose","");
            cVar4 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)avy::AvyLog_abi_cxx11_,(key_type *)local_330);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_);
            }
            if (cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Cex is accepted by CFG ",0x17);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            }
          }
          CondEpsGen<covenant::Sym>::~CondEpsGen(&local_1c8);
        }
      }
      else if (avy::AvyLogFlag == '\x01') {
        local_1c8.digest =
             (cfg_digest_t *)
             ((long)&local_1c8.word.super__Vector_base<int,_std::allocator<int>_> + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"verbose","");
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)avy::AvyLog_abi_cxx11_,(key_type *)&local_1c8);
        if (local_1c8.digest !=
            (cfg_digest_t *)
            ((long)&local_1c8.word.super__Vector_base<int,_std::allocator<int>_> + 8U)) {
          operator_delete(local_1c8.digest);
        }
        if (cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Automata ",9);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," is exact\n",10);
        }
      }
      uVar17 = (ulong)((int)uVar17 + 1);
      pCVar14 = (this->digests).
                super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)(this->digests).
                     super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar14 >> 3) *
              -0x79435e50d79435e5;
    } while (uVar17 <= uVar9 && uVar9 - uVar17 != 0);
    ppuVar7 = (undefined **)*local_368;
  }
  (*(code *)ppuVar7[1])();
  if (avy::AvyLogFlag == '\x01') {
    local_1c8.digest =
         (cfg_digest_t *)((long)&local_1c8.word.super__Vector_base<int,_std::allocator<int>_> + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"solver","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)avy::AvyLog_abi_cxx11_,(key_type *)&local_1c8);
    if (local_1c8.digest !=
        (cfg_digest_t *)((long)&local_1c8.word.super__Vector_base<int,_std::allocator<int>_> + 8U))
    {
      operator_delete(local_1c8.digest);
    }
    if (cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Refinement done.\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"===================================================\n",0x34)
      ;
    }
  }
  return bVar12;
}

Assistant:

bool refine(witness_t& witness, 
              GeneralizationMethod gen, 
              bool REFINE_ONLY_FIRST) 
  {


    LOG("solver", 
        cout << "Solution found: ";
        cout << witness_impl::to_string(witness, tfac) << "\n");
    
    if (opts.is_dot_enabled)
    {
      witness_t tmp(witness);
      dfa_t Cex = witness_impl::to_automata<EdgeSym> (tmp, tfac);
                                                      
      Cex.print_dot(refine_log, "Cex ");
    }

   
    // Choose here the generalization method.
    eps_refine_t* r = NULL;
    if(gen == MAX_GEN)
      r = new max_eps_refine_t(alphstart, alphsz);
    else 
      r = new greedy_eps_refine_t();
    
    bool refined = false;
    for(unsigned int li = 0; li < digests.size(); li++)
    {
      // L_i is regular, so w \in L_i
      if(exact[li]) 
      {
        LOG("verbose" , cout << "Automata " << li << " is exact\n");
        continue;
      }
      
      // First, we check if the witness is in the language.
      cond_eps_gen_t gen(digests[li], witness, tfac);
      if(!gen.is_empty())
      {
        LOG("verbose", cout << "Cex is accepted by CFG " << li << "\n");
        continue;
      }
      
      // Otherwise, we refine it.
      dfa_t gen_lang(r->refine(gen));
      
// #ifndef REFINE_DIFF
//       // Haven't currently extended solvers to handle complemented
//       // languages.
//       gen_lang.eps_elim();
//       dfa_t ref_complement(complement(makeDFA(gen_lang, 
//                                                       cfgs[li].alphstart, 
//                                                       cfgs[li].alphsz)));
      
//       // We can either just add ref_complement to the set of regular
//       // languages, or intersect it with an approximation.
//       reg_langs.push_back(ref_complement);
// #else
      gen_lang.eps_elim();

      if (opts.is_dot_enabled)
      {
        gen_lang.print_dot(refine_log, 
                           string("Generalized cex wrt CFG ") + 
                           boost::lexical_cast<string> (li)) ;
      }

      boost::optional<dfa_t> refined_fa = dfa_t::difference (reg_langs[li], 
                                                             gen_lang, 
                                                             cfgs[li].alphstart, 
                                                             cfgs[li].alphsz);
      
      if (!refined_fa)
      {
        throw error ("refinement did not make any progress");
      }
      
      reg_langs[li] = *refined_fa;
 
      LOG("solver", 
            cout << "New refined regular approximation:\n" << *refined_fa << "\n");
           

//#endif
      refined = true;
      LOG("verbose", cout << "Automata " << li << " refined.\n");
      if(REFINE_ONLY_FIRST)
        break;
    }
    
    delete r;
    
    LOG("solver", 
         cout << "Refinement done.\n";
         cout << "===================================================\n");
    
    return refined;
  }